

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_cp437_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  uchar c;
  zueci_u32 *p_u_local;
  uint flags_local;
  zueci_u32 len_local;
  uchar *src_local;
  
  bVar1 = *src;
  if (bVar1 < 0x80) {
    *p_u = (uint)bVar1;
  }
  else {
    *p_u = (uint)zueci_cp437_u_u
                 [(int)"\x153#\x1d\x1e\x1b\x1f!$%\")(&\x12\x13\x16 \x14-.+204\x18\x19\x02\x03\x04C5\x1c\',1*\x17\x05\r\x11L\a\x10\x0f\x01\x06\x0e|}~PVkl`_m[agfeRSXWUOYhid^spjZvqrnocb\\]utTQyxz{w;\x1a6>8?\v@97:<FA=GI\tKJMN/H\bD\fEB\n\x7f"
                       [(int)(bVar1 - 0x80)]];
  }
  return 1;
}

Assistant:

static int zueci_cp437_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    const unsigned char c = *src;
    (void)len; (void)flags;
    if (c < 0x80) {
        *p_u = c;
        return 1;
    }
    *p_u = zueci_cp437_u_u[(int) zueci_cp437_sb_u[c - 0x80]]; /* No undefined */
    return 1;
}